

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O3

void Abc_NtkTransferPointers(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkAig)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  
  pAVar5 = Abc_AigConst1(pNtk);
  pAVar6 = Abc_AigConst1(pNtkAig);
  (pAVar5->field_6).pCopy = pAVar6;
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if (pNtkAig->vCis->nSize <= lVar7) goto LAB_0026778f;
      *(void **)((long)pVVar8->pArray[lVar7] + 0x40) = pNtkAig->vCis->pArray[lVar7];
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if (pNtkAig->vCos->nSize <= lVar7) goto LAB_0026778f;
      *(void **)((long)pVVar8->pArray[lVar7] + 0x40) = pNtkAig->vCos->pArray[lVar7];
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if ((*(uint *)((long)pVVar8->pArray[lVar7] + 0x14) & 0xf) == 8) {
        if (pNtkAig->vBoxes->nSize <= lVar7) goto LAB_0026778f;
        *(void **)((long)pVVar8->pArray[lVar7] + 0x40) = pNtkAig->vBoxes->pArray[lVar7];
        pVVar8 = pNtk->vBoxes;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar7];
      if ((((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) &&
          (uVar3 = *(ulong *)((long)pvVar2 + 0x40), uVar3 != 0)) &&
         (uVar4 = *(ulong *)((uVar3 & 0xfffffffffffffffe) + 0x48),
         ((uint)uVar3 & 1) != uVar4 && uVar4 != 0)) {
        uVar1 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 4);
        uVar9 = (int)uVar1 >> 1;
        if (((int)uVar9 < 0) || (pNtkAig->vObjs->nSize <= (int)uVar9)) {
LAB_0026778f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(ulong *)((long)pvVar2 + 0x40) =
             (ulong)(((uint)uVar4 ^ (uint)uVar3 ^ uVar1) & 1) ^ (ulong)pNtkAig->vObjs->pArray[uVar9]
        ;
        pVVar8 = pNtk->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar8->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTransferPointers( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkAig )
{
    Abc_Obj_t * pObj;
    Ivy_Obj_t * pObjIvy, * pObjFraig;
    int i;
    pObj = Abc_AigConst1(pNtk);
    pObj->pCopy = Abc_AigConst1(pNtkAig);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCi(pNtkAig, i);
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkCo(pNtkAig, i);
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkBox(pNtkAig, i);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObjIvy = (Ivy_Obj_t *)pObj->pCopy;
        if ( pObjIvy == NULL )
            continue;
        pObjFraig = Ivy_ObjEquiv( pObjIvy );
        if ( pObjFraig == NULL )
            continue;
        pObj->pCopy = Abc_EdgeToNode( pNtkAig, Ivy_Regular(pObjFraig)->TravId );
        pObj->pCopy = Abc_ObjNotCond( pObj->pCopy, Ivy_IsComplement(pObjFraig) );
    }
}